

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetra-codec-impl.c
# Opt level: O3

void Lsp_Az(tetra_codec *st,Word16 *lsp,Word16 *a)

{
  uint uVar1;
  ulong uVar2;
  short *psVar3;
  uint uVar4;
  long lVar5;
  short sVar6;
  uint uVar7;
  Word32 f2 [6];
  Word32 f1 [6];
  uint auStack_60 [8];
  uint auStack_40 [8];
  
  auStack_60[0] = 0x107b58;
  auStack_60[1] = 0;
  Get_Lsp_Pol(st,lsp,(Word32 *)(auStack_40 + 2));
  auStack_60[0] = 0x107b6a;
  auStack_60[1] = 0;
  Get_Lsp_Pol(st,lsp + 1,(Word32 *)(auStack_60 + 2));
  uVar2 = 6;
  do {
    uVar7 = auStack_40[uVar2 + 1];
    uVar4 = auStack_40[uVar2] + uVar7;
    if ((-1 < (int)(auStack_40[uVar2] ^ uVar7)) && ((int)(uVar4 ^ uVar7) < 0)) {
      uVar4 = 0x7fffffff - ((int)uVar7 >> 0x1f);
      st->Overflow = 1;
    }
    auStack_40[uVar2 + 1] = uVar4;
    uVar4 = auStack_60[uVar2 + 1];
    uVar7 = uVar4 - auStack_60[uVar2];
    if (((int)(auStack_60[uVar2] ^ uVar4) < 0) && ((int)(uVar7 ^ uVar4) < 0)) {
      uVar7 = 0x7fffffff - ((int)uVar4 >> 0x1f);
      st->Overflow = 1;
    }
    auStack_60[uVar2 + 1] = uVar7;
    uVar2 = uVar2 - 1;
  } while (1 < uVar2);
  *a = 0x1000;
  psVar3 = a + 10;
  lVar5 = 0;
  do {
    uVar7 = *(uint *)((long)auStack_40 + lVar5 * 2 + 0xc);
    uVar1 = *(uint *)((long)auStack_60 + lVar5 * 2 + 0xc);
    uVar4 = uVar1 + uVar7;
    uVar2 = (ulong)uVar4;
    if (((int)(uVar1 ^ uVar7) < 0) || (-1 < (int)(uVar4 ^ uVar7))) {
      if (-1 < (int)uVar4) goto LAB_00107c1e;
LAB_00107c27:
      sVar6 = (short)((int)uVar4 >> 0xd);
    }
    else {
      st->Overflow = 1;
      uVar2 = 0x7fffffff;
      if ((int)uVar7 < 0) {
        uVar4 = 0x80000000;
        goto LAB_00107c27;
      }
LAB_00107c1e:
      uVar4 = (uint)uVar2;
      sVar6 = (short)(uVar2 >> 0xd);
    }
    *(ushort *)((long)a + lVar5 + 2) = sVar6 + (ushort)((uVar4 >> 0xc & 1) != 0);
    uVar4 = uVar7 - uVar1;
    if (((int)(uVar1 ^ uVar7) < 0) && ((int)(uVar4 ^ uVar7) < 0)) {
      st->Overflow = 1;
      uVar4 = 0x7fffffff;
      if ((int)uVar7 < 0) {
        uVar4 = 0x80000000;
        goto LAB_00107c78;
      }
LAB_00107c70:
      sVar6 = (short)(uVar4 >> 0xd);
    }
    else {
      if (-1 < (int)uVar4) goto LAB_00107c70;
LAB_00107c78:
      sVar6 = (short)((int)uVar4 >> 0xd);
    }
    *psVar3 = sVar6 + (ushort)((uVar4 >> 0xc & 1) != 0);
    psVar3 = psVar3 + -1;
    lVar5 = lVar5 + 2;
    if (lVar5 == 10) {
      return;
    }
  } while( true );
}

Assistant:

void Lsp_Az(tetra_codec* st, Word16 lsp[], Word16 a[])
{
  Word16 i, j;
  Word32 f1[6], f2[6];
  Word32 t0;

  Get_Lsp_Pol(st, &lsp[0],f1);
  Get_Lsp_Pol(st, &lsp[1],f2);

  for (i = 5; i > 0; i--)
  {
    f1[i] = L_add(st, f1[i], f1[i-1]);			/* f1[i] += f1[i-1]; */
    f2[i] = L_sub(st, f2[i], f2[i-1]);			/* f2[i] -= f2[i-1]; */
  }

  a[0] = 4096;
  for (i = 1, j = 10; i <= 5; i++, j--)
  {
    t0   = L_add(st, f1[i], f2[i]);			/* f1[i] + f2[i] */
    a[i] = extract_l( L_shr_r(st, t0,(Word16)13) );	/*from Q24 to Q12 and * 0.5*/
    t0   = L_sub(st, f1[i], f2[i]);			/* f1[i] - f2[i] */
    a[j] = extract_l( L_shr_r(st, t0,(Word16)13) );	/*from Q24 to Q12 and * 0.5*/
  }

  return;
}